

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOReadFmsMetaData(FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsIOMetaDataInfo *mdinfo)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  void *pvVar5;
  char *in_RCX;
  FmsIOFunctions *in_RDX;
  FmsIOContext *in_RSI;
  undefined8 in_RDI;
  char *ki;
  char temp [21];
  char *kdata_3;
  char *ksize;
  FmsIOMetaDataInfo *mds;
  FmsInt i;
  char *md_str;
  char *kdata_2;
  char *kdata_1;
  char *kdata;
  char *kname;
  char *str;
  char *kmdtype;
  int err;
  char *in_stack_ffffffffffffff48;
  char **in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  ulong local_70;
  undefined8 local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RCX == (char *)0x0) {
    local_4 = 1;
  }
  else {
    local_38 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_40 = 0;
    iVar1 = (*(code *)in_RSI[3].temp_strings)(in_RDI,local_38,&local_40);
    if (local_38 != (char *)0x0) {
      free(local_38);
    }
    if (iVar1 == 0) {
      iVar1 = FmsGetMetaDataTypeFromName(in_stack_ffffffffffffff48,(FmsMetaDataType *)0x120b62);
      if (iVar1 == 0) {
        local_48 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        iVar1 = (*(code *)in_RSI[3].temp_strings)(in_RDI,local_48,in_RCX + 8);
        if (local_48 != (char *)0x0) {
          free(local_48);
        }
        if (iVar1 == 0) {
          switch(*(undefined4 *)in_RCX) {
          case 0:
            local_50 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            iVar1 = (*(code *)in_RSI[2].temp_strings)
                              (in_RDI,local_50,in_RCX + 4,in_RCX + 0x18,in_RCX + 0x10);
            if (local_50 != (char *)0x0) {
              free(local_50);
            }
            if (iVar1 != 0) {
              return 5;
            }
            break;
          case 1:
            local_58 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            iVar1 = (*(code *)in_RSI[3].temp_strings_cap)
                              (in_RDI,local_58,in_RCX + 4,in_RCX + 0x18,in_RCX + 0x10);
            if (local_58 != (char *)0x0) {
              free(local_58);
            }
            if (iVar1 != 0) {
              return 6;
            }
            break;
          case 2:
            local_60 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            local_68 = 0;
            iVar1 = (*(code *)in_RSI[3].temp_strings)(in_RDI,local_60,&local_68);
            if (local_60 != (char *)0x0) {
              free(local_60);
            }
            if ((iVar1 != 0) ||
               (iVar1 = FmsIOCopyString(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50),
               iVar1 != 0)) {
              return 7;
            }
            break;
          case 3:
            pcVar4 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            uVar2 = (*(code *)in_RSI[2].temp_strings_cap)(in_RDI,pcVar4,in_RCX + 0x10);
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            if (uVar2 != 0) {
              return 8;
            }
            pvVar5 = calloc(*(size_t *)(in_RCX + 0x10),0x20);
            *(void **)(in_RCX + 0x18) = pvVar5;
            pcVar4 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            for (local_70 = 0; local_70 < *(ulong *)(in_RCX + 0x10); local_70 = local_70 + 1) {
              sprintf(&stack0xffffffffffffff58,"%lu",local_70);
              join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
              uVar3 = FmsIOReadFmsMetaData
                                (in_RSI,in_RDX,in_RCX,
                                 (FmsIOMetaDataInfo *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
              uVar2 = uVar3 | uVar2;
            }
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            if (uVar2 != 0) {
              return 9;
            }
          }
          local_4 = 0;
        }
        else {
          local_4 = 4;
        }
      }
      else {
        local_4 = 3;
      }
    }
    else {
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

static int
FmsIOReadFmsMetaData(FmsIOContext *ctx, FmsIOFunctions *io, const char *key,
                     FmsIOMetaDataInfo *mdinfo) {
  int err = 0;
  if(!mdinfo) E_RETURN(1);

  {
    char *kmdtype = join_keys(key, "MetaDataType");
    const char *str = NULL;
    err = (*io->get_string)(ctx, kmdtype, &str);
    FREE(kmdtype);
    if(err)
      E_RETURN(2);
    if(FmsGetMetaDataTypeFromName(str, &mdinfo->mdtype))
      E_RETURN(3);
  }

  // Get name
  {
    char *kname = join_keys(key, "Name");
    err = (*io->get_string)(ctx, kname, &mdinfo->name);
    FREE(kname);
    if(err)
      E_RETURN(4);
  }

  switch (mdinfo->mdtype) {
  case FMS_INTEGER: {
    // Get DataArray
    char *kdata = join_keys(key, "Data");
    err = (*io->get_typed_int_array)(ctx, kdata, &mdinfo->subtype.i_type,
                                     &mdinfo->data, &mdinfo->size);
    FREE(kdata);
    if(err)
      E_RETURN(5);
    break;
  }
  case FMS_SCALAR: {
    // Get data array
    char *kdata = join_keys(key, "Data");
    err = (*io->get_scalar_array)(ctx, kdata, &mdinfo->subtype.s_type,
                                  &mdinfo->data, &mdinfo->size);
    FREE(kdata);
    if(err)
      E_RETURN(6);
    break;
  }
  case FMS_STRING: {
    // Get data array
    char *kdata = join_keys(key, "Data");
    const char *md_str = NULL;
    err = (*io->get_string)(ctx, kdata, &md_str);
    FREE(kdata);
    /* Copy the string we got from the get_string. Its lifetime has to be tied to the metadata. */
    if(err || FmsIOCopyString(md_str, (char **)&mdinfo->data))
      E_RETURN(7);
    break;
  }
  case FMS_META_DATA: {
    // Get size
    FmsInt i;
    FmsIOMetaDataInfo *mds = NULL;
    char *ksize = join_keys(key, "Size"), *kdata = NULL;
    err = (*io->get_int)(ctx, ksize, &mdinfo->size);
    FREE(ksize);
    if(err)
      E_RETURN(8);
    mdinfo->data = calloc(mdinfo->size, sizeof(FmsIOMetaDataInfo));
    mds = (FmsIOMetaDataInfo *)mdinfo->data;
    kdata = join_keys(key, "Data");
    for(i = 0; i < mdinfo->size; i++) {
      char temp[21], *ki = NULL;
      sprintf(temp, FMS_LU, i);
      ki = join_keys(kdata, temp);
      err |= FmsIOReadFmsMetaData(ctx, io, ki, &mds[i]);
    }
    FREE(kdata);
    if(err)
      E_RETURN(9);
    break;
  }
  default:
    break;
  }
  return 0;
}